

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_misc.cpp
# Opt level: O0

string * log_info<char[1]>(string *__return_storage_ptr__,char (*what) [1],level_enum logger_level)

{
  string local_2e0 [32];
  string local_2c0 [39];
  allocator local_299;
  string local_298;
  shared_ptr<spdlog::sinks::sink> local_278;
  allocator local_261;
  string local_260;
  undefined1 local_240 [8];
  logger oss_logger;
  undefined1 local_1a8 [8];
  shared_ptr<spdlog::sinks::ostream_sink<std::mutex>_> oss_sink;
  ostringstream oss;
  level_enum logger_level_local;
  char (*what_local) [1];
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)
             &oss_sink.
              super___shared_ptr<spdlog::sinks::ostream_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::make_shared<spdlog::sinks::ostream_sink<std::mutex>,std::__cxx11::ostringstream&>
            ((basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_260,"oss",&local_261);
  std::shared_ptr<spdlog::sinks::sink>::shared_ptr<spdlog::sinks::ostream_sink<std::mutex>,void>
            (&local_278,(shared_ptr<spdlog::sinks::ostream_sink<std::mutex>_> *)local_1a8);
  spdlog::logger::logger((logger *)local_240,&local_260,&local_278);
  std::shared_ptr<spdlog::sinks::sink>::~shared_ptr(&local_278);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator((allocator<char> *)&local_261);
  spdlog::logger::set_level((logger *)local_240,logger_level);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"%v",&local_299);
  spdlog::logger::set_pattern((logger *)local_240,&local_298,local);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  spdlog::logger::info<char[1]>((logger *)local_240,what);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)local_2c0);
  std::__cxx11::string::~string(local_2e0);
  std::__cxx11::string::~string(local_2c0);
  spdlog::logger::~logger((logger *)local_240);
  std::shared_ptr<spdlog::sinks::ostream_sink<std::mutex>_>::~shared_ptr
            ((shared_ptr<spdlog::sinks::ostream_sink<std::mutex>_> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)
             &oss_sink.
              super___shared_ptr<spdlog::sinks::ostream_sink<std::mutex>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string log_info(const T &what, spdlog::level::level_enum logger_level = spdlog::level::info)
{

    std::ostringstream oss;
    auto oss_sink = std::make_shared<spdlog::sinks::ostream_sink_mt>(oss);

    spdlog::logger oss_logger("oss", oss_sink);
    oss_logger.set_level(logger_level);
    oss_logger.set_pattern("%v");
    oss_logger.info(what);

    return oss.str().substr(0, oss.str().length() - strlen(spdlog::details::os::default_eol));
}